

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

ParseResult __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
Parse<272u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte bVar1;
  size_t sVar2;
  Ch *pCVar3;
  byte *pbVar4;
  undefined4 uVar5;
  ParseResult PVar6;
  
  *(undefined4 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  while( true ) {
    pbVar4 = (byte *)is->current_;
    bVar1 = *pbVar4;
    if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
  }
  if (*(int *)(this + 0x30) != 0) goto LAB_0015c25e;
  if (bVar1 == 0) {
    uVar5 = 1;
  }
  else {
    ParseValue<272u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler);
    if (*(int *)(this + 0x30) != 0) goto LAB_0015c25e;
    while( true ) {
      pbVar4 = (byte *)is->current_;
      bVar1 = *pbVar4;
      if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    }
    if ((bVar1 == 0) || (*(int *)(this + 0x30) != 0)) goto LAB_0015c25e;
    uVar5 = 2;
  }
  sVar2 = is->count_;
  pCVar3 = is->buffer_;
  *(undefined4 *)(this + 0x30) = uVar5;
  *(byte **)(this + 0x38) = pbVar4 + (sVar2 - (long)pCVar3);
LAB_0015c25e:
  PVar6._4_4_ = 0;
  PVar6.code_ = *(uint *)(this + 0x30);
  *(undefined8 *)(this + 0x18) = *(undefined8 *)(this + 0x10);
  PVar6.offset_ = *(size_t *)(this + 0x38);
  return PVar6;
}

Assistant:

ParseResult Parse(InputStream& is, Handler& handler) {
        if (parseFlags & kParseIterativeFlag)
            return IterativeParse<parseFlags>(is, handler);

        parseResult_.Clear();

        ClearStackOnExit scope(*this);

        SkipWhitespaceAndComments<parseFlags>(is);
        CEREAL_RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

        if (CEREAL_RAPIDJSON_UNLIKELY(is.Peek() == '\0')) {
            CEREAL_RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorDocumentEmpty, is.Tell());
            CEREAL_RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);
        }
        else {
            ParseValue<parseFlags>(is, handler);
            CEREAL_RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

            if (!(parseFlags & kParseStopWhenDoneFlag)) {
                SkipWhitespaceAndComments<parseFlags>(is);
                CEREAL_RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

                if (CEREAL_RAPIDJSON_UNLIKELY(is.Peek() != '\0')) {
                    CEREAL_RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorDocumentRootNotSingular, is.Tell());
                    CEREAL_RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);
                }
            }
        }

        return parseResult_;
    }